

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::utils::Generator::calcMinSeparation
          (ChVector<double> *__return_storage_ptr__,Generator *this,ChVector<double> *sep)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer psVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  psVar6 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->m_mixture).
                super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
  if (lVar7 == 0) {
    dVar8 = 0.0;
  }
  else {
    lVar7 = lVar7 >> 4;
    dVar8 = sep->m_data[2];
    dVar1 = sep->m_data[0];
    dVar2 = sep->m_data[1];
    auVar10._0_8_ =
         MixtureIngredient::calcMinSeparation
                   (psVar6[lVar7 + (ulong)(lVar7 == 0) + -1].
                    super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    auVar10._8_56_ = extraout_var;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2;
    auVar9 = auVar10._0_16_;
    auVar3 = vmaxsd_avx(auVar9,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar8;
    auVar4 = vmaxsd_avx(auVar9,auVar4);
    __return_storage_ptr__->m_data[1] = auVar3._0_8_;
    __return_storage_ptr__->m_data[2] = auVar4._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1;
    auVar3 = vmaxsd_avx(auVar9,auVar5);
    dVar8 = auVar3._0_8_;
  }
  __return_storage_ptr__->m_data[0] = dVar8;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Generator::calcMinSeparation(const ChVector<>& sep) {
    ChVector<> res;

    for (int i = 0; i < m_mixture.size(); i++) {
        double mix_sep = m_mixture[i]->calcMinSeparation();
        res.x() = std::max(sep.x(), mix_sep);
        res.y() = std::max(sep.y(), mix_sep);
        res.z() = std::max(sep.z(), mix_sep);
    }

    return res;
}